

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void TPZSkylMatrix<double>::InitializeElem
               (TPZVec<long> *skyline,TPZVec<double> *storage,TPZVec<double_*> *point)

{
  double *pdVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  double local_30;
  
  lVar4 = skyline->fNElements;
  iVar2 = NumElements(skyline);
  (*storage->_vptr_TPZVec[3])(storage,iVar2);
  local_30 = 0.0;
  TPZVec<double>::Fill(storage,&local_30,0,-1);
  (*point->_vptr_TPZVec[3])(point,lVar4 + 1);
  if (lVar4 == 0) {
    *point->fStore = (double *)0x0;
  }
  else {
    pdVar1 = storage->fStore;
    *point->fStore = pdVar1;
    point->fStore[lVar4] = pdVar1 + iVar2;
  }
  lVar3 = 0;
  if (0 < lVar4) {
    lVar3 = lVar4;
  }
  lVar4 = 8;
  while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
    *(long *)((long)point->fStore + lVar4) =
         *(long *)((long)point->fStore + lVar4 + -8) +
         *(long *)((long)skyline->fStore + lVar4 + -8) * -8 + lVar4;
    lVar4 = lVar4 + 8;
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::InitializeElem(const TPZVec<int64_t> &skyline, TPZVec<TVar> &storage, TPZVec<TVar *> &point) {   // JORGE 2013 OUTUBRO ???
	int64_t dim = skyline.NElements();
	int64_t nel = NumElements(skyline);
#ifdef PZDEBUG
    //	std::cout << "Skyline Matrix, Number of elements : " << nel << " in floating point " << nel*sizeof(TVar) << std::endl;
#endif
	storage.Resize(nel);
	storage.Fill(0.);
	int64_t i;
	point.Resize(dim+1);
	if(dim) {
		point[0] = &storage[0];
		point[dim] = &storage[0]+nel;
	} else {
		point[0] = 0;
	}
	for(i=1; i<dim+1; i++)
		point[i] = point[i-1]+(i-1)-skyline[i-1]+1;
}